

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O0

void apply_J_sources(fdtd3D *fdtd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_RDI;
  float_type fVar11;
  uintmax_t i;
  uintmax_t (*JsourceLocations) [3];
  float_type_0__0_ *ez;
  float_type_0__0_ *ey;
  float_type_0__0_ *ex;
  fdtd_source *src;
  float_type time;
  ulong local_30;
  
  src = *(fdtd_source **)(in_RDI + 400);
  time = *(float_type *)(in_RDI + 0x198);
  lVar1 = *(long *)(in_RDI + 0x38);
  lVar2 = *(long *)(in_RDI + 400);
  lVar3 = *(long *)(in_RDI + 0x198);
  lVar4 = *(long *)(in_RDI + 0x40);
  lVar5 = *(long *)(in_RDI + 400);
  lVar6 = *(long *)(in_RDI + 0x198);
  lVar7 = *(long *)(in_RDI + 0x48);
  lVar8 = *(long *)(in_RDI + 0x1b8);
  for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0x1a8); local_30 = local_30 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x1b0) + local_30 * 0x20) == 0) {
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar1 + *(long *)(lVar8 + local_30 * 0x18) * (long)src * (long)time * 8 +
               (long)time * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 8);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar4 + *(long *)(lVar8 + local_30 * 0x18) * lVar2 * lVar3 * 8 +
               lVar3 * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 8);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
      fVar11 = gaussian_pulse_val(time,src);
      lVar10 = lVar7 + *(long *)(lVar8 + local_30 * 0x18) * lVar5 * lVar6 * 8 +
               lVar6 * *(long *)(lVar8 + local_30 * 0x18 + 8) * 8;
      lVar9 = *(long *)(lVar8 + local_30 * 0x18 + 8);
      *(double *)(lVar10 + lVar9 * 8) = fVar11 + *(double *)(lVar10 + lVar9 * 8);
    }
  }
  return;
}

Assistant:

static void apply_J_sources(struct fdtd1D *fdtd) {
  for (uintmax_t i = 0; i < fdtd->num_Jsources; ++i) {
    switch (fdtd->Jsources[i].type) {
    case source_gaussian_pulse:
      fdtd->ez[fdtd->JsourceLocations[i]] +=
          gaussian_pulse_val(fdtd->time, &fdtd->Jsources[i]);
      break;
    default:
      break;
    }
  }
}